

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_quality.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  bool bVar7;
  uint8_t *data;
  size_t data_size;
  uint8_t *local_48;
  size_t local_40;
  ulong local_38;
  
  uVar4 = 0;
  if (1 < argc) {
    local_38 = (ulong)(uint)argc;
    iVar3 = 1;
    bVar1 = false;
    uVar6 = 2;
    do {
      pcVar5 = argv[uVar6 - 1];
      iVar2 = strcmp(pcVar5,"-quiet");
      bVar7 = true;
      if (iVar2 != 0) {
        iVar3 = strcmp(pcVar5,"-help");
        if ((iVar3 == 0) || (((*pcVar5 == '-' && (pcVar5[1] == 'h')) && (pcVar5[2] == '\0')))) {
          puts("webp_quality [-h][-quiet] webp_files...");
          return 0;
        }
        local_48 = (uint8_t *)0x0;
        local_40 = 0;
        iVar3 = ImgIoUtilReadFile(pcVar5,&local_48,&local_40);
        if (iVar3 == 0) {
          return 1;
        }
        uVar4 = VP8EstimateQuality(local_48,local_40);
        if (bVar1) {
          if (-1 < (int)uVar4) {
            pcVar5 = "%d\n";
            goto LAB_00103486;
          }
LAB_001034b7:
          main_cold_1();
          iVar3 = 0;
        }
        else {
          printf("[%s] ",pcVar5);
          if ((int)uVar4 < 0) goto LAB_001034b7;
          pcVar5 = "Estimated quality factor: %d\n";
LAB_00103486:
          printf(pcVar5,(ulong)uVar4);
        }
        free(local_48);
        bVar7 = bVar1;
      }
      bVar1 = bVar7;
    } while ((iVar3 != 0) && (bVar7 = uVar6 < local_38, uVar6 = uVar6 + 1, bVar7));
    uVar4 = (uint)(iVar3 == 0);
  }
  return uVar4;
}

Assistant:

int main(int argc, const char* argv[]) {
  int c;
  int quiet = 0;
  int ok = 1;

  INIT_WARGV(argc, argv);

  for (c = 1; ok && c < argc; ++c) {
    if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-help") || !strcmp(argv[c], "-h")) {
      printf("webp_quality [-h][-quiet] webp_files...\n");
      FREE_WARGV_AND_RETURN(0);
    } else {
      const char* const filename = (const char*)GET_WARGV(argv, c);
      const uint8_t* data = NULL;
      size_t data_size = 0;
      int q;
      ok = ImgIoUtilReadFile(filename, &data, &data_size);
      if (!ok) break;
      q = VP8EstimateQuality(data, data_size);
      if (!quiet) WPRINTF("[%s] ", (const W_CHAR*)filename);
      if (q < 0) {
        fprintf(stderr, "Not a WebP file, or not a lossy WebP file.\n");
        ok = 0;
      } else {
        if (!quiet) {
          printf("Estimated quality factor: %d\n", q);
        } else {
          printf("%d\n", q);   // just print the number
        }
      }
      free((void*)data);
    }
  }
  FREE_WARGV_AND_RETURN(ok ? 0 : 1);
}